

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_string(void)

{
  bool bVar1;
  uchar (*in_RDX) [5];
  uchar (*input_00) [6];
  uchar (*input_01) [8];
  uchar (*input_02) [12];
  type local_1b0;
  undefined1 local_188 [8];
  basic_variable<std::allocator<char>_> result_3;
  undefined8 local_150;
  value_type input_3 [12];
  undefined1 local_118 [8];
  basic_variable<std::allocator<char>_> result_2;
  value_type input_2 [8];
  undefined1 local_b8 [8];
  basic_variable<std::allocator<char>_> result_1;
  undefined4 local_80;
  undefined2 local_7c;
  value_type input_1 [6];
  undefined1 local_48 [8];
  basic_variable<std::allocator<char>_> result;
  undefined4 local_10;
  undefined1 local_c;
  value_type input [5];
  
  local_c = 0x43;
  local_10 = 0x424103a9;
  trial::protocol::bintoken::parse<unsigned_char[5],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_48,(bintoken *)&local_10,in_RDX);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                    ((basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_impl
            ("result.is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x7e,"void parser_suite::parse_string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
            ((type *)input_1,(basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.value<string>()","\"ABC\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x7f,"void parser_suite::parse_string()",input_1,"ABC");
  std::__cxx11::string::~string((string *)input_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  local_7c = 0x4342;
  local_80 = 0x410003b9;
  trial::protocol::bintoken::parse<unsigned_char[6],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_b8,(bintoken *)&local_80,input_00);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                    ((basic_variable<std::allocator<char>_> *)local_b8);
  boost::detail::test_impl
            ("result.is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x85,"void parser_suite::parse_string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
            ((type *)input_2,(basic_variable<std::allocator<char>_> *)local_b8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.value<string>()","\"ABC\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x86,"void parser_suite::parse_string()",input_2,"ABC");
  std::__cxx11::string::~string((string *)input_2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_b8);
  result_2.storage._40_8_ = 0x43424100000003c9;
  trial::protocol::bintoken::parse<unsigned_char[8],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_118,
             (bintoken *)&result_2.storage.field_0x28,input_01);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                    ((basic_variable<std::allocator<char>_> *)local_118);
  boost::detail::test_impl
            ("result.is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x8c,"void parser_suite::parse_string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
            ((type *)(input_3 + 8),(basic_variable<std::allocator<char>_> *)local_118);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.value<string>()","\"ABC\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x8d,"void parser_suite::parse_string()",input_3 + 8,"ABC");
  std::__cxx11::string::~string((string *)(input_3 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_118);
  input_3[0] = '\0';
  input_3[1] = 'A';
  input_3[2] = 'B';
  input_3[3] = 'C';
  local_150 = 0x3d9;
  trial::protocol::bintoken::parse<unsigned_char[12],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_188,(bintoken *)&local_150,input_02);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                    ((basic_variable<std::allocator<char>_> *)local_188);
  boost::detail::test_impl
            ("result.is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x93,"void parser_suite::parse_string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::value<trial::dynamic::string>
            (&local_1b0,(basic_variable<std::allocator<char>_> *)local_188);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.value<string>()","\"ABC\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x94,"void parser_suite::parse_string()",&local_1b0,"ABC");
  std::__cxx11::string::~string((string *)&local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_188);
  return;
}

Assistant:

void parse_string()
{
    // string8
    {
        const value_type input[] = { bintoken::token::code::string8, 0x03, 0x41, 0x42, 0x43 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<string>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<string>(), "ABC");
    }
    // string16
    {
        const value_type input[] = { bintoken::token::code::string16, 0x03, 0x00, 0x41, 0x42, 0x43 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<string>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<string>(), "ABC");
    }
    // string32
    {
        const value_type input[] = { bintoken::token::code::string32, 0x03, 0x00, 0x00, 0x00, 0x41, 0x42, 0x43 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<string>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<string>(), "ABC");
    }
    // string64
    {
        const value_type input[] = { bintoken::token::code::string64, 0x03, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x41, 0x42, 0x43 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<string>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<string>(), "ABC");
    }
}